

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O1

type __thiscall
nonstd::optional_lite::
optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>_>
::operator=(optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>_>
            *this,optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>_>
                  *other)

{
  if (this->has_value_ == true) {
    if (other->has_value_ == false) {
      std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::~vector
                ((vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)
                 ((long)&this->contained + 8));
      this->has_value_ = false;
      return this;
    }
  }
  else {
    if (other->has_value_ == true) {
      optional<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>>
      ::
      initialize<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>>
                ((optional<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>>
                  *)this,(pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>
                          *)&other->contained);
      return this;
    }
    if (this->has_value_ == false) {
      return this;
    }
  }
  if (other->has_value_ == true) {
    *(undefined4 *)&this->contained = *(undefined4 *)&other->contained;
    std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::_M_move_assign
              ((vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)
               ((long)&this->contained + 8),(undefined1 *)((long)&other->contained + 8));
  }
  return this;
}

Assistant:

operator=( optional && other ) noexcept
    {
        if      ( (has_value() == true ) && (other.has_value() == false) ) { reset(); }
        else if ( (has_value() == false) && (other.has_value() == true ) ) { initialize( std::move( *other ) ); }
        else if ( (has_value() == true ) && (other.has_value() == true ) ) { contained.value() = std::move( *other ); }
        return *this;
    }